

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript.hpp
# Opt level: O0

void __thiscall chaiscript::ChaiScript::~ChaiScript(ChaiScript *this)

{
  ChaiScript *this_local;
  
  ~ChaiScript(this);
  operator_delete(this,800);
  return;
}

Assistant:

ChaiScript(std::vector<std::string> t_modulepaths = {},
               std::vector<std::string> t_usepaths = {},
               std::vector<Options> t_opts = chaiscript::default_options())
        : ChaiScript_Basic(chaiscript::Std_Lib::library(),
                           std::make_unique<parser::ChaiScript_Parser<eval::Noop_Tracer, optimizer::Optimizer_Default>>(),
                           std::move(t_modulepaths),
                           std::move(t_usepaths),
                           std::move(t_opts)) {
    }